

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O0

void __thiscall QLayout::widgetEvent(QLayout *this,QEvent *e)

{
  bool bVar1;
  Type TVar2;
  QLayoutPrivate *this_00;
  QWidget *w;
  QObjectPrivate *pQVar3;
  QLayoutItem *in_RSI;
  QObjectPrivate *op;
  QObject *child;
  QChildEvent *c;
  Type type;
  QLayoutPrivate *d;
  
  this_00 = d_func((QLayout *)0x33d361);
  TVar2 = QEvent::type((QEvent *)in_RSI);
  if ((((byte)this_00->field_0x8c >> 1 & 1) != 0) || (TVar2 == ChildRemoved)) {
    if (TVar2 == Resize) {
      if (((byte)this_00->field_0x8c >> 2 & 1) == 0) {
        activate((QLayout *)d);
      }
      else {
        QLayoutPrivate::doResize(this_00);
      }
    }
    else if (TVar2 == ChildRemoved) {
      w = (QWidget *)QChildEvent::child((QChildEvent *)in_RSI);
      pQVar3 = QObjectPrivate::get((QObject *)0x33d419);
      if ((*(uint *)(pQVar3 + 0x30) >> 10 & 1) != 0) {
        if (w == this_00->menubar) {
          this_00->menubar = (QWidget *)0x0;
        }
        removeWidgetRecursively(in_RSI,&w->super_QObject);
      }
    }
    else if (TVar2 == LayoutRequest) {
      QObject::parent((QObject *)0x33d473);
      bVar1 = QWidget::isVisible((QWidget *)0x33d47b);
      if (bVar1) {
        activate((QLayout *)d);
      }
    }
  }
  return;
}

Assistant:

void QLayout::widgetEvent(QEvent *e)
{
    Q_D(QLayout);
    const QEvent::Type type = e->type();
    if (!d->enabled && type != QEvent::ChildRemoved)
        return;

    switch (type) {
    case QEvent::Resize:
        if (d->activated)
            d->doResize();
        else
            activate();
        break;
    case QEvent::ChildRemoved:
        {
            QChildEvent *c = (QChildEvent *)e;
            QObject *child = c->child();
            QObjectPrivate *op = QObjectPrivate::get(child);
            if (op->wasWidget) {
#if QT_CONFIG(menubar)
                if (child == d->menubar)
                    d->menubar = nullptr;
#endif
                removeWidgetRecursively(this, child);
            }
        }
        break;
    case QEvent::LayoutRequest:
        if (static_cast<QWidget *>(parent())->isVisible())
            activate();
        break;
    default:
        break;
    }
}